

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

Section * getSection(char *name,SectionType type,uint32_t org,SectionSpec *attrs,SectionModifier mod
                    )

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  Section *local_38;
  Section *sect;
  uint32_t mask;
  uint16_t alignOffset;
  uint8_t alignment;
  uint32_t bank;
  SectionModifier mod_local;
  SectionSpec *attrs_local;
  uint32_t org_local;
  SectionType type_local;
  char *name_local;
  
  mask = attrs->bank;
  sect._7_1_ = attrs->alignment;
  sect._4_2_ = attrs->alignOfs;
  if (mask == 0xffffffff) {
    uVar3 = nbbanks(type);
    if (uVar3 == 1) {
      mask = sectionTypeInfo[type].firstBank;
    }
  }
  else if ((((type == SECTTYPE_ROMX) || (type == SECTTYPE_VRAM)) || (type == SECTTYPE_SRAM)) ||
          (type == SECTTYPE_WRAMX)) {
    if ((mask < sectionTypeInfo[type].firstBank) || (sectionTypeInfo[type].lastBank < mask)) {
      error("%s bank value $%04x out of range ($%04x to $%04x)\n",sectionTypeInfo[type].name,
            (ulong)mask,(ulong)sectionTypeInfo[type].firstBank,(ulong)sectionTypeInfo[type].lastBank
           );
    }
  }
  else {
    error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
  }
  if (1 << (sect._7_1_ & 0x1f) <= (int)(uint)sect._4_2_) {
    error("Alignment offset (%u) must be smaller than alignment size (%u)\n",(ulong)sect._4_2_,
          (ulong)(uint)(1 << (sect._7_1_ & 0x1f)));
    sect._4_2_ = 0;
  }
  if ((org != 0xffffffff) &&
     ((org < sectionTypeInfo[type].startAddr || (uVar2 = endaddr(type), uVar2 < org)))) {
    uVar1 = sectionTypeInfo[type].startAddr;
    uVar2 = endaddr(type);
    error("Section \"%s\"\'s fixed address $%04x is outside of range [$%04x; $%04x]\n",name,
          (ulong)org,(ulong)uVar1,(ulong)uVar2);
  }
  attrs_local._0_4_ = org;
  if (sect._7_1_ != 0) {
    if (0x10 < sect._7_1_) {
      error("Alignment must be between 0 and 16, not %u\n",(ulong)sect._7_1_);
      sect._7_1_ = 0x10;
    }
    uVar4 = (1 << (sect._7_1_ & 0x1f)) - 1;
    if (org == 0xffffffff) {
      if ((sectionTypeInfo[type].startAddr & uVar4) == 0) {
        if (sect._7_1_ == 0x10) {
          sect._7_1_ = 0;
          attrs_local._0_4_ = 0;
        }
      }
      else {
        error("Section \"%s\"\'s alignment cannot be attained in %s\n",name,
              sectionTypeInfo[type].name);
        sect._7_1_ = 0;
        attrs_local._0_4_ = 0;
      }
    }
    else {
      if ((org - sect._4_2_ & uVar4) != 0) {
        error("Section \"%s\"\'s fixed address doesn\'t match its alignment\n",name);
      }
      sect._7_1_ = 0;
    }
  }
  local_38 = sect_FindSectionByName(name);
  if (local_38 == (Section *)0x0) {
    local_38 = createSection(name,type,(uint32_t)attrs_local,mask,sect._7_1_,sect._4_2_,mod);
    local_38->next = sectionList;
    sectionList = local_38;
  }
  else {
    mergeSections(local_38,type,(uint32_t)attrs_local,mask,sect._7_1_,sect._4_2_,mod);
  }
  return local_38;
}

Assistant:

static struct Section *getSection(char const *name, enum SectionType type, uint32_t org,
				  struct SectionSpec const *attrs, enum SectionModifier mod)
{
	uint32_t bank = attrs->bank;
	uint8_t alignment = attrs->alignment;
	uint16_t alignOffset = attrs->alignOfs;

	// First, validate parameters, and normalize them if applicable

	if (bank != (uint32_t)-1) {
		if (type != SECTTYPE_ROMX && type != SECTTYPE_VRAM
		 && type != SECTTYPE_SRAM && type != SECTTYPE_WRAMX)
			error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
		else if (bank < sectionTypeInfo[type].firstBank || bank > sectionTypeInfo[type].lastBank)
			error("%s bank value $%04" PRIx32 " out of range ($%04" PRIx32 " to $%04"
				PRIx32 ")\n", sectionTypeInfo[type].name, bank,
				sectionTypeInfo[type].firstBank, sectionTypeInfo[type].lastBank);
	} else if (nbbanks(type) == 1) {
		// If the section type only has a single bank, implicitly force it
		bank = sectionTypeInfo[type].firstBank;
	}

	if (alignOffset >= 1 << alignment) {
		error("Alignment offset (%" PRIu16 ") must be smaller than alignment size (%u)\n",
		      alignOffset, 1U << alignment);
		alignOffset = 0;
	}

	if (org != (uint32_t)-1) {
		if (org < sectionTypeInfo[type].startAddr || org > endaddr(type))
			error("Section \"%s\"'s fixed address $%04" PRIx32
				" is outside of range [$%04" PRIx16 "; $%04" PRIx16 "]\n",
				name, org, sectionTypeInfo[type].startAddr, endaddr(type));
	}

	if (alignment != 0) {
		if (alignment > 16) {
			error("Alignment must be between 0 and 16, not %u\n", alignment);
			alignment = 16;
		}
		// It doesn't make sense to have both alignment and org set
		uint32_t mask = mask(alignment);

		if (org != (uint32_t)-1) {
			if ((org - alignOffset) & mask)
				error("Section \"%s\"'s fixed address doesn't match its alignment\n",
					name);
			alignment = 0; // Ignore it if it's satisfied
		} else if (sectionTypeInfo[type].startAddr & mask) {
			error("Section \"%s\"'s alignment cannot be attained in %s\n",
				name, sectionTypeInfo[type].name);
			alignment = 0; // Ignore it if it's unattainable
			org = 0;
		} else if (alignment == 16) {
			// Treat an alignment of 16 as being fixed at address 0
			alignment = 0;
			org = 0;
			// The address is known to be valid, since the alignment is
		}
	}

	// Check if another section exists with the same name; merge if yes, otherwise create one

	struct Section *sect = sect_FindSectionByName(name);

	if (sect) {
		mergeSections(sect, type, org, bank, alignment, alignOffset, mod);
	} else {
		sect = createSection(name, type, org, bank, alignment, alignOffset, mod);
		// Add the new section to the list (order doesn't matter)
		sect->next = sectionList;
		sectionList = sect;
	}

	return sect;
}